

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SC.cpp
# Opt level: O3

void __thiscall OpenMD::SC::calcFunctional(SC *this,SelfData *sdat)

{
  double dVar1;
  double dVar2;
  int iVar3;
  pointer pSVar4;
  double dVar5;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  pSVar4 = (this->SCdata).
           super__Vector_base<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = (this->SCtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[sdat->atid];
  dVar1 = pSVar4[iVar3].c;
  dVar2 = pSVar4[iVar3].epsilon;
  dVar5 = sdat->rho;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar5 = -dVar1 * dVar2 * dVar5;
  sdat->frho = dVar5;
  sdat->dfrhodrho = (dVar5 * 0.5) / sdat->rho;
  (sdat->selfPot).data_[3] = (sdat->selfPot).data_[3] + dVar5;
  if (sdat->isSelected == true) {
    (sdat->selePot).data_[3] = (sdat->selePot).data_[3] + dVar5;
  }
  if (sdat->doParticlePot == true) {
    sdat->particlePot = dVar5 + sdat->particlePot;
  }
  return;
}

Assistant:

void SC::calcFunctional(SelfData& sdat) {
    if (!initialized_) initialize();

    SCAtomData& data1 = SCdata[SCtids[sdat.atid]];

    RealType u     = -data1.c * data1.epsilon * sqrt(sdat.rho);
    sdat.frho      = u;
    sdat.dfrhodrho = 0.5 * sdat.frho / sdat.rho;

    sdat.selfPot[METALLIC_EMBEDDING_FAMILY] += u;

    if (sdat.isSelected) sdat.selePot[METALLIC_EMBEDDING_FAMILY] += u;

    if (sdat.doParticlePot) { sdat.particlePot += u; }

    return;
  }